

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_gen_image_gradient_h_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,rf_color left,rf_color right,
          rf_color *dst,rf_int dst_size)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  ulong uVar12;
  undefined1 auVar13 [13];
  undefined1 auVar14 [16];
  rf_color *prVar15;
  long lVar16;
  rf_color *prVar17;
  long lVar18;
  short sVar19;
  float fVar20;
  undefined1 auVar23 [16];
  float fVar24;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar21;
  undefined6 uVar22;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  auVar14 = _DAT_00177d80;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (width * height * 4 <= dst_size) {
    if (0 < width) {
      auVar8[0xc] = right.a;
      auVar8._0_12_ = ZEXT712(0);
      uVar12 = (ulong)left._0_2_ & 0xffffffffffff00ff;
      auVar9._8_4_ = 0;
      auVar9._0_8_ = uVar12;
      auVar9[0xc] = left.a;
      auVar10[8] = left.b;
      auVar10._0_8_ = uVar12;
      auVar10[9] = 0;
      auVar10._10_3_ = auVar9._10_3_;
      auVar13._5_8_ = 0;
      auVar13._0_5_ = auVar10._8_5_;
      auVar11[4] = left.g;
      auVar11._0_4_ = (int)uVar12;
      auVar11[5] = 0;
      auVar11._6_7_ = SUB137(auVar13 << 0x40,6);
      lVar16 = 0;
      prVar17 = dst;
      do {
        if (0 < height) {
          fVar20 = (float)lVar16 / (float)width;
          fVar24 = 1.0 - fVar20;
          auVar23._0_4_ = (int)(fVar20 * (float)((uint)right & 0xff) + fVar24 * (float)(int)uVar12);
          auVar23._4_4_ =
               (int)(fVar20 * (float)((uint)right >> 8 & 0xff) + fVar24 * (float)auVar11._4_4_);
          auVar23._8_4_ =
               (int)(fVar20 * (float)(int)CONCAT32(auVar8._10_3_,(ushort)right.b) +
                    fVar24 * (float)auVar10._8_4_);
          auVar23._12_4_ =
               (int)(fVar20 * (float)(uint3)(auVar8._10_3_ >> 0x10) +
                    fVar24 * (float)(uint3)(auVar9._10_3_ >> 0x10));
          auVar23 = auVar23 & auVar14;
          sVar5 = auVar23._0_2_;
          cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar23[0] - (0xff < sVar5);
          sVar5 = auVar23._2_2_;
          sVar19 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar23[2] - (0xff < sVar5),cVar1);
          sVar5 = auVar23._4_2_;
          cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar23[4] - (0xff < sVar5);
          sVar5 = auVar23._6_2_;
          uVar21 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar23[6] - (0xff < sVar5),
                            CONCAT12(cVar2,sVar19));
          sVar5 = auVar23._8_2_;
          cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar23[8] - (0xff < sVar5);
          sVar5 = auVar23._10_2_;
          uVar22 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar23[10] - (0xff < sVar5),
                            CONCAT14(cVar3,uVar21));
          sVar5 = auVar23._12_2_;
          cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar23[0xc] - (0xff < sVar5);
          sVar7 = auVar23._14_2_;
          sVar5 = (short)((uint)uVar21 >> 0x10);
          sVar6 = (short)((uint6)uVar22 >> 0x20);
          sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar23[0xe] - (0xff < sVar7),
                                   CONCAT16(cVar4,uVar22)) >> 0x30);
          prVar15 = prVar17;
          lVar18 = (long)height;
          do {
            prVar15->r = (0 < sVar19) * (sVar19 < 0x100) * cVar1 - (0xff < sVar19);
            prVar15->g = (0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5);
            prVar15->b = (0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6);
            prVar15->a = (0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7);
            prVar15 = prVar15 + width;
            lVar18 = lVar18 + -1;
          } while (lVar18 != 0);
        }
        lVar16 = lVar16 + 1;
        prVar17 = prVar17 + 1;
      } while (lVar16 != width);
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_gradient_h_to_buffer(int width, int height, rf_color left, rf_color right, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int i = 0; i < width; i++)
        {
            float factor = ((float)i) / ((float)width);

            for (rf_int j = 0; j < height; j++)
            {
                ((rf_color*)dst)[j * width + i].r = (int)((float)right.r * factor + (float)left.r * (1.f - factor));
                ((rf_color*)dst)[j * width + i].g = (int)((float)right.g * factor + (float)left.g * (1.f - factor));
                ((rf_color*)dst)[j * width + i].b = (int)((float)right.b * factor + (float)left.b * (1.f - factor));
                ((rf_color*)dst)[j * width + i].a = (int)((float)right.a * factor + (float)left.a * (1.f - factor));
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true
        };
    }

    return result;
}